

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O2

void __thiscall
wasm::MultiMemoryLowering::Replacer::visitMemoryGrow(Replacer *this,MemoryGrow *curr)

{
  pointer pNVar1;
  size_t sVar2;
  char *pcVar3;
  mapped_type *pmVar4;
  Call *expression;
  initializer_list<wasm::Expression_*> __l;
  Name target;
  _Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_58;
  Expression *local_40;
  allocator_type local_31;
  
  pmVar4 = std::__detail::
           _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::at((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 *)&this->parent->memoryIdxMap,&curr->memory);
  pNVar1 = (this->parent->memoryGrowNames).
           super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar2 = pNVar1[*pmVar4].super_IString.str._M_len;
  pcVar3 = pNVar1[*pmVar4].super_IString.str._M_str;
  local_40 = curr->delta;
  __l._M_len = 1;
  __l._M_array = &local_40;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&local_58,__l,
             &local_31);
  target.super_IString.str._M_str = pcVar3;
  target.super_IString.str._M_len = sVar2;
  expression = Builder::makeCall(&this->builder,target,
                                 (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                                 &local_58,
                                 (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)21>).
                                       super_Expression.type.id,false);
  Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
  ::replaceCurrent(&(this->
                    super_WalkerPass<wasm::PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>_>
                    ).
                    super_PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
                    .
                    super_Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
                   ,(Expression *)expression);
  std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
            (&local_58);
  return;
}

Assistant:

void visitMemoryGrow(MemoryGrow* curr) {
      auto idx = parent.memoryIdxMap.at(curr->memory);
      Name funcName = parent.memoryGrowNames[idx];
      replaceCurrent(builder.makeCall(funcName, {curr->delta}, curr->type));
    }